

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::MessageGenerator::class_name_abi_cxx11_
          (string *__return_storage_ptr__,MessageGenerator *this)

{
  DescriptorStringView psVar1;
  MessageGenerator *this_local;
  
  psVar1 = Descriptor::name_abi_cxx11_(this->descriptor_);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string MessageGenerator::class_name() {
  return std::string(descriptor_->name());
}